

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereUsablePartialIndex(int iTab,u8 jointype,WhereClause *pWC,Expr *pWhere)

{
  u8 uVar1;
  Expr *pE1;
  int iVar2;
  int iVar3;
  Parse *pParse;
  WhereTerm *pWVar4;
  
  if ((jointype & 0x40) == 0) {
    pParse = pWC->pWInfo->pParse;
    uVar1 = pWhere->op;
    while (uVar1 == ',') {
      iVar2 = whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft);
      if (iVar2 == 0) {
        return 0;
      }
      pWhere = pWhere->pRight;
      uVar1 = pWhere->op;
    }
    if ((pParse->db->flags & 0x800000) != 0) {
      pParse = (Parse *)0x0;
    }
    if (0 < pWC->nTerm) {
      pWVar4 = pWC->a;
      iVar2 = 0;
      do {
        pE1 = pWVar4->pExpr;
        if ((pE1->flags & 1) == 0) {
          if ((jointype & 0x20) == 0) {
LAB_0018e57f:
            iVar3 = sqlite3ExprImpliesExpr(pParse,pE1,pWhere,iTab);
            if ((iVar3 != 0) && ((pWVar4->wtFlags & 0x80) == 0)) {
              return 1;
            }
          }
        }
        else if ((pE1->w).iJoin == iTab) goto LAB_0018e57f;
        iVar2 = iVar2 + 1;
        pWVar4 = pWVar4 + 1;
      } while (iVar2 < pWC->nTerm);
    }
  }
  return 0;
}

Assistant:

static int whereUsablePartialIndex(
  int iTab,             /* The table for which we want an index */
  u8 jointype,          /* The JT_* flags on the join */
  WhereClause *pWC,     /* The WHERE clause of the query */
  Expr *pWhere          /* The WHERE clause from the partial index */
){
  int i;
  WhereTerm *pTerm;
  Parse *pParse;

  if( jointype & JT_LTORJ ) return 0;
  pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_OuterON) || pExpr->w.iJoin==iTab)
     && ((jointype & JT_OUTER)==0 || ExprHasProperty(pExpr, EP_OuterON))
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab)
     && (pTerm->wtFlags & TERM_VNULL)==0
    ){
      return 1;
    }
  }
  return 0;
}